

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# missing_deps.cc
# Opt level: O2

void __thiscall
MissingDependencyPrinter::OnMissingDep
          (MissingDependencyPrinter *this,Node *node,string *path,Rule *generator)

{
  ostream *poVar1;
  
  poVar1 = std::operator<<((ostream *)&std::cout,"Missing dep: ");
  poVar1 = std::operator<<(poVar1,(string *)node);
  poVar1 = std::operator<<(poVar1," uses ");
  poVar1 = std::operator<<(poVar1,(string *)path);
  poVar1 = std::operator<<(poVar1," (generated by ");
  poVar1 = std::operator<<(poVar1,(string *)generator);
  std::operator<<(poVar1,")\n");
  return;
}

Assistant:

void MissingDependencyPrinter::OnMissingDep(Node* node, const std::string& path,
                                            const Rule& generator) {
  std::cout << "Missing dep: " << node->path() << " uses " << path
            << " (generated by " << generator.name() << ")\n";
}